

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O3

Struct * __thiscall
spvtools::opt::InstrumentPass::GetStruct
          (InstrumentPass *this,
          vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          *fields)

{
  IRContext *this_00;
  int iVar1;
  Type *pTVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Struct s;
  Struct local_80;
  
  analysis::Struct::Struct(&local_80,fields);
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(this_00);
  }
  pTVar2 = analysis::TypeManager::GetRegisteredType
                     ((this_00->type_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                      _M_head_impl,&local_80.super_Type);
  if (pTVar2 != (Type *)0x0) {
    iVar1 = (*pTVar2->_vptr_Type[0x1b])(pTVar2);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      iVar1 = (*pTVar2->_vptr_Type[0x1b])(pTVar2);
      local_80.super_Type._vptr_Type = (_func_int **)&PTR__Struct_003daea8;
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
      ::_M_erase(&local_80.element_decorations_._M_t,
                 (_Link_type)
                 local_80.element_decorations_._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_parent);
      if (local_80.element_types_.
          super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.element_types_.
                        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_80.element_types_.
                              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.element_types_.
                              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_80.super_Type._vptr_Type = (_func_int **)&PTR__Type_003d7f68;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_80.super_Type.decorations_);
      return (Struct *)CONCAT44(extraout_var_00,iVar1);
    }
  }
  __assert_fail("type && type->AsStruct()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instrument_pass.cpp"
                ,0x18a,
                "analysis::Struct *spvtools::opt::InstrumentPass::GetStruct(const std::vector<const analysis::Type *> &)"
               );
}

Assistant:

analysis::Struct* InstrumentPass::GetStruct(
    const std::vector<const analysis::Type*>& fields) {
  analysis::Struct s(fields);
  analysis::Type* type = context()->get_type_mgr()->GetRegisteredType(&s);
  assert(type && type->AsStruct());
  return type->AsStruct();
}